

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate.c
# Opt level: O2

uint64_t dsOffset(void *address)

{
  dsCrate *crate;
  uint64_t uVar1;
  
  crate = getActiveCrate();
  if (crate != (dsCrate *)0x0) {
    uVar1 = objectOffset(crate,address);
    return uVar1;
  }
  dsRunLogCallback("%s(): Can\'t get active crate.\n","dsOffset");
  return 0xffffffffffffffff;
}

Assistant:

uint64_t
dsOffset(void *address)
{
	dsCrate *crate;

	if ((crate = getActiveCrate()) == NULL) {
		dsLog("Can't get active crate.\n");
		return UINT64_MAX;
	}

	return objectOffset(crate, address);
}